

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutFlowBC.cpp
# Opt level: O1

void OutFlowBC::GetOutFlowFaces
               (bool *haveOutFlow,Orientation *outFaces,BCRec *_phys_bc,int *numOutFlowBC)

{
  int idir;
  long lVar1;
  
  *haveOutFlow = false;
  *numOutFlowBC = 0;
  lVar1 = 0;
  do {
    if (_phys_bc->bc[lVar1] == 2) {
      *haveOutFlow = true;
      outFaces[*numOutFlowBC].val = (int)lVar1;
      *numOutFlowBC = *numOutFlowBC + 1;
    }
    if (_phys_bc->bc[lVar1 + 3] == 2) {
      *haveOutFlow = true;
      outFaces[*numOutFlowBC].val = (int)lVar1 + 3;
      *numOutFlowBC = *numOutFlowBC + 1;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  return;
}

Assistant:

void
OutFlowBC::GetOutFlowFaces (bool&        haveOutFlow,
                            Orientation* outFaces,
                            BCRec*       _phys_bc,
                            int&        numOutFlowBC)
{
    haveOutFlow = false;

    numOutFlowBC = 0;

    for (int idir = 0; idir < BL_SPACEDIM; idir++)
    {
        if (_phys_bc->lo(idir) == Outflow)
        {
            haveOutFlow = true;
            outFaces[numOutFlowBC] = Orientation(idir,Orientation::low);
            numOutFlowBC++;
        }

        if (_phys_bc->hi(idir) == Outflow)
        {
            haveOutFlow = true;
            outFaces[numOutFlowBC] = Orientation(idir,Orientation::high);
            numOutFlowBC++;
        }
    }
}